

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlSchematronParserCtxtPtr xmlSchematronNewMemParserCtxt(char *buffer,int size)

{
  xmlDictPtr pxVar1;
  xmlXPathContextPtr pxVar2;
  xmlSchematronParserCtxtPtr ret;
  int size_local;
  char *buffer_local;
  
  if ((buffer == (char *)0x0) || (size < 1)) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)(*xmlMalloc)(0x90);
    if ((xmlSchematronParserCtxtPtr)buffer_local == (xmlSchematronParserCtxtPtr)0x0) {
      xmlSchematronPErrMemory
                ((xmlSchematronParserCtxtPtr)0x0,"allocating schema parser context",(xmlNodePtr)0x0)
      ;
      buffer_local = (char *)0x0;
    }
    else {
      memset(buffer_local,0,0x90);
      ((xmlSchematronParserCtxtPtr)buffer_local)->buffer = buffer;
      ((xmlSchematronParserCtxtPtr)buffer_local)->size = size;
      pxVar1 = xmlDictCreate();
      ((xmlSchematronParserCtxtPtr)buffer_local)->dict = pxVar1;
      pxVar2 = xmlXPathNewContext((xmlDocPtr)0x0);
      ((xmlSchematronParserCtxtPtr)buffer_local)->xctxt = pxVar2;
      if (((xmlSchematronParserCtxtPtr)buffer_local)->xctxt == (xmlXPathContextPtr)0x0) {
        xmlSchematronPErrMemory
                  ((xmlSchematronParserCtxtPtr)0x0,"allocating schema parser XPath context",
                   (xmlNodePtr)0x0);
        xmlSchematronFreeParserCtxt((xmlSchematronParserCtxtPtr)buffer_local);
        buffer_local = (char *)0x0;
      }
    }
  }
  return (xmlSchematronParserCtxtPtr)buffer_local;
}

Assistant:

xmlSchematronParserCtxtPtr
xmlSchematronNewMemParserCtxt(const char *buffer, int size)
{
    xmlSchematronParserCtxtPtr ret;

    if ((buffer == NULL) || (size <= 0))
        return (NULL);

    ret =
        (xmlSchematronParserCtxtPtr)
        xmlMalloc(sizeof(xmlSchematronParserCtxt));
    if (ret == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser context",
                                NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronParserCtxt));
    ret->buffer = buffer;
    ret->size = size;
    ret->dict = xmlDictCreate();
    ret->xctxt = xmlXPathNewContext(NULL);
    if (ret->xctxt == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser XPath context",
                                NULL);
	xmlSchematronFreeParserCtxt(ret);
        return (NULL);
    }
    return (ret);
}